

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *
pbrt::Triangle::CreateTriangles
          (vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
           *__return_storage_ptr__,TriangleMesh *mesh,Allocator alloc)

{
  uint uVar1;
  ulong uVar2;
  ShapeHandle *pSVar3;
  Triangle *pTVar4;
  ulong uVar5;
  Triangle *pTVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  int vb;
  size_t va;
  TriangleMesh *mesh_local;
  Allocator alloc_local;
  
  mesh_local = mesh;
  alloc_local = alloc;
  std::mutex::lock(&CreateTriangles::allMeshesLock);
  uVar2 = allMeshes->nStored;
  vb = -0x80000000;
  va = uVar2;
  if (uVar2 < 0xffffffff80000000) {
    pstd::
    vector<const_pbrt::TriangleMesh_*,_pstd::pmr::polymorphic_allocator<const_pbrt::TriangleMesh_*>_>
    ::push_back(allMeshes,&mesh_local);
    pthread_mutex_unlock((pthread_mutex_t *)&CreateTriangles::allMeshesLock);
    va = (size_t)alloc.memoryResource;
    pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::vector
              (__return_storage_ptr__,(long)mesh_local->nTriangles,
               (polymorphic_allocator<pbrt::ShapeHandle> *)&va);
    pTVar4 = pstd::pmr::polymorphic_allocator<std::byte>::allocate_object<pbrt::Triangle>
                       (&alloc_local,(long)mesh_local->nTriangles);
    pSVar3 = __return_storage_ptr__->ptr;
    uVar1 = mesh_local->nTriangles;
    pTVar6 = pTVar4;
    for (uVar5 = 0; (~((int)uVar1 >> 0x1f) & uVar1) != uVar5; uVar5 = uVar5 + 1) {
      uVar7 = (ulong)pTVar6 | 0x4000000000000;
      pTVar4[uVar5].meshIndex = (int)uVar2;
      pTVar4[uVar5].triIndex = (int)uVar5;
      pTVar6 = pTVar6 + 1;
      pSVar3[uVar5].
      super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
      .bits = uVar7;
    }
    *(long *)(in_FS_OFFSET + -0x410) = *(long *)(in_FS_OFFSET + -0x410) + (long)(int)uVar1 * 8;
    return __return_storage_ptr__;
  }
  LogFatal<char_const(&)[18],char_const(&)[8],char_const(&)[18],unsigned_long&,char_const(&)[8],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes.cpp"
             ,0x10a,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [18])"allMeshes->size()"
             ,(char (*) [8])"1 << 31",(char (*) [18])"allMeshes->size()",&va,(char (*) [8])"1 << 31"
             ,&vb);
}

Assistant:

pstd::vector<ShapeHandle> Triangle::CreateTriangles(const TriangleMesh *mesh,
                                                    Allocator alloc) {
    static std::mutex allMeshesLock;
    allMeshesLock.lock();
    CHECK_LT(allMeshes->size(), 1 << 31);
    int meshIndex = int(allMeshes->size());
    allMeshes->push_back(mesh);
    allMeshesLock.unlock();

    pstd::vector<ShapeHandle> tris(mesh->nTriangles, alloc);
    Triangle *t = alloc.allocate_object<Triangle>(mesh->nTriangles);
    for (int i = 0; i < mesh->nTriangles; ++i) {
        alloc.construct(&t[i], meshIndex, i);
        tris[i] = &t[i];
    }
    triangleBytes += mesh->nTriangles * sizeof(Triangle);
    return tris;
}